

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat3 * dja::adjugate(mat3 *__return_storage_ptr__,mat3 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  
  mat3::mat3(__return_storage_ptr__,1.0);
  uVar6 = m->m[1].y;
  uVar8 = m->m[1].z;
  uVar7 = m->m[0].y;
  uVar9 = m->m[0].z;
  fVar1 = m->m[1].x;
  fVar2 = m->m[2].y;
  fVar3 = m->m[2].x;
  fVar4 = m->m[2].z;
  __return_storage_ptr__->m[0].x = fVar4 * (float)uVar6 + -(float)uVar8 * fVar2;
  __return_storage_ptr__->m[0].y = -(float)uVar7 * fVar4 + fVar2 * (float)uVar9;
  __return_storage_ptr__->m[0].z = (float)uVar8 * (float)uVar7 + -(float)uVar9 * (float)uVar6;
  __return_storage_ptr__->m[1].x = fVar4 * -fVar1 + fVar3 * (float)uVar8;
  fVar5 = m->m[0].x;
  __return_storage_ptr__->m[1].y = fVar4 * fVar5 + -(float)uVar9 * fVar3;
  __return_storage_ptr__->m[1].z = (float)uVar8 * -fVar5 + fVar1 * (float)uVar9;
  __return_storage_ptr__->m[2].x = fVar1 * fVar2 + -(float)uVar6 * fVar3;
  __return_storage_ptr__->m[2].y = fVar2 * -fVar5 + fVar3 * (float)uVar7;
  __return_storage_ptr__->m[2].z = fVar5 * (float)uVar6 - fVar1 * (float)uVar7;
  return __return_storage_ptr__;
}

Assistant:

mat3 adjugate(const mat3& m)
{
    mat3 a;

    M00(a) = M11(m) * M22(m) - M12(m) * M21(m);
    M01(a) =-M01(m) * M22(m) + M02(m) * M21(m);
    M02(a) = M01(m) * M12(m) - M02(m) * M11(m);

    M10(a) =-M10(m) * M22(m) + M12(m) * M20(m);
    M11(a) = M00(m) * M22(m) - M02(m) * M20(m);
    M12(a) =-M00(m) * M12(m) + M02(m) * M10(m);

    M20(a) = M10(m) * M21(m) - M11(m) * M20(m);
    M21(a) =-M00(m) * M21(m) + M01(m) * M20(m);
    M22(a) = M00(m) * M11(m) - M01(m) * M10(m);

    return a;
}